

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

bool __thiscall asmjit::v1_14::String::equals(String *this,char *other,size_t size)

{
  String *pSVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  String *__s1;
  bool bVar5;
  
  uVar3 = (ulong)(byte)*this;
  if (uVar3 < 0x1f) {
    __s1 = this + 1;
  }
  else {
    uVar3 = *(ulong *)(this + 8);
    __s1 = *(String **)(this + 0x18);
  }
  if (size == 0xffffffffffffffff) {
    uVar4 = 0;
    while (uVar3 != uVar4) {
      pSVar1 = (String *)(other + uVar4);
      if (__s1[uVar4] != *pSVar1) {
        return false;
      }
      uVar4 = uVar4 + 1;
      if (*pSVar1 == (String)0x0) {
        return false;
      }
    }
    bVar5 = other[uVar3] == '\0';
  }
  else if (uVar3 == size) {
    iVar2 = bcmp(__s1,other,size);
    bVar5 = iVar2 == 0;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool String::equals(const char* other, size_t size) const noexcept {
  const char* aData = data();
  const char* bData = other;

  size_t aSize = this->size();
  size_t bSize = size;

  if (bSize == SIZE_MAX) {
    size_t i;
    for (i = 0; i < aSize; i++)
      if (aData[i] != bData[i] || bData[i] == 0)
        return false;
    return bData[i] == 0;
  }
  else {
    if (aSize != bSize)
      return false;
    return ::memcmp(aData, bData, aSize) == 0;
  }
}